

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::
basic_csv_cursor<char,jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
::basic_csv_cursor<jsoncons::iterator_source<(anonymous_namespace)::MyIterator>>
          (basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
           *this,iterator_source<(anonymous_namespace)::MyIterator> *source,
          basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc,type *param_6)

{
  uint uVar1;
  basic_staj_visitor<char> *in_RDX;
  basic_staj_cursor<char> *in_RDI;
  allocator<char> *in_stack_00000218;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_00000220;
  basic_csv_decode_options<char> *in_stack_00000228;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000230;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  text_source_adaptor<jsoncons::iterator_source<(anonymous_namespace)::MyIterator>_>
  *in_stack_ffffffffffffff70;
  
  ser_context::ser_context((ser_context *)(in_RDI + 0x55));
  basic_staj_cursor<char>::basic_staj_cursor(in_RDI);
  in_RDI->_vptr_basic_staj_cursor = (_func_int **)(vtable + 0x18);
  in_RDI[0x55]._vptr_basic_staj_cursor = (_func_int **)(vtable + 0xb8);
  text_source_adaptor<jsoncons::iterator_source<(anonymous_namespace)::MyIterator>>::
  text_source_adaptor<jsoncons::iterator_source<(anonymous_namespace)::MyIterator>>
            (in_stack_ffffffffffffff70,
             (iterator_source<(anonymous_namespace)::MyIterator> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)in_RDX,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)(in_RDI + 9)
            );
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x4a231c);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDX);
  basic_csv_parser<char,_std::allocator<char>_>::cursor_mode
            ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 9),true);
  uVar1 = (*in_RDI->_vptr_basic_staj_cursor[3])();
  if ((uVar1 & 1) == 0) {
    (*in_RDI->_vptr_basic_staj_cursor[7])();
  }
  return;
}

Assistant:

basic_csv_cursor(Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options = basic_csv_decode_options<CharT>(),
        std::function<bool(csv_errc,const ser_context&)> err_handler = default_csv_parsing(),
        const Allocator& alloc = Allocator(),
        typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(std::forward<Sourceable>(source)),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }